

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool CoreML::hasIOS14NeuralNetworkFeatures(Model *model)

{
  bool bVar1;
  int iVar2;
  LayerCase LVar3;
  UpsampleLayerParams_LinearUpsampleMode UVar4;
  ReorganizeDataLayerParams_ReorganizationType RVar5;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  NeuralNetworkLayer *this_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  SliceDynamicLayerParams *this_02;
  UpsampleLayerParams *pUVar6;
  ReorganizeDataLayerParams *this_03;
  InnerProductLayerParams *this_04;
  BatchedMatMulLayerParams *this_05;
  NeuralNetworkLayer *layer;
  int i;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *layers;
  Model *model_local;
  
  bVar1 = hasDefaultValueForOptionalInputs(model);
  if (bVar1) {
    model_local._7_1_ = true;
  }
  else {
    this = getNNSpec(model);
    if (this != (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)0x0) {
      for (layer._4_4_ = 0;
          iVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::
                  size(this), layer._4_4_ < iVar2; layer._4_4_ = layer._4_4_ + 1) {
        this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::
                  operator[](this,layer._4_4_);
        LVar3 = Specification::NeuralNetworkLayer::layer_case(this_00);
        if (LVar3 == kInnerProduct) {
LAB_003565e5:
          this_04 = Specification::NeuralNetworkLayer::innerproduct(this_00);
          bVar1 = Specification::InnerProductLayerParams::int8dynamicquantize(this_04);
          if (bVar1) {
            return true;
          }
LAB_00356604:
          this_05 = Specification::NeuralNetworkLayer::batchedmatmul(this_00);
          bVar1 = Specification::BatchedMatMulLayerParams::int8dynamicquantize(this_05);
          if (bVar1) {
            return true;
          }
        }
        else {
          if (LVar3 == kUpsample) {
LAB_0035658a:
            pUVar6 = Specification::NeuralNetworkLayer::upsample(this_00);
            UVar4 = Specification::UpsampleLayerParams::linearupsamplemode(pUVar6);
            if (UVar4 != UpsampleLayerParams_LinearUpsampleMode_DEFAULT) {
              return true;
            }
            pUVar6 = Specification::NeuralNetworkLayer::upsample(this_00);
            iVar2 = Specification::UpsampleLayerParams::fractionalscalingfactor_size(pUVar6);
            if (0 < iVar2) {
              return true;
            }
LAB_003565c7:
            this_03 = Specification::NeuralNetworkLayer::reorganizedata(this_00);
            RVar5 = Specification::ReorganizeDataLayerParams::mode(this_03);
            if (RVar5 == ReorganizeDataLayerParams_ReorganizationType_PIXEL_SHUFFLE) {
              return true;
            }
            goto LAB_003565e5;
          }
          if (LVar3 == kReorganizeData) goto LAB_003565c7;
          if (LVar3 == kSliceDynamic) {
            this_01 = Specification::NeuralNetworkLayer::input_abi_cxx11_(this_00);
            iVar2 = google::protobuf::
                    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::size(this_01);
            if (iVar2 == 7) {
              return true;
            }
            this_02 = Specification::NeuralNetworkLayer::slicedynamic(this_00);
            iVar2 = Specification::SliceDynamicLayerParams::squeezemasks_size(this_02);
            if (iVar2 != 0) {
              return true;
            }
            goto LAB_0035658a;
          }
          if (LVar3 == kBatchedMatmul) goto LAB_00356604;
          if ((((LVar3 == kOneHot) || (LVar3 == kCumSum)) || (LVar3 - kClampedReLU < 2)) ||
             ((LVar3 - kPooling3D < 2 || (LVar3 == kSliceBySize || LVar3 == kConvolution3D)))) {
            return true;
          }
        }
      }
    }
    model_local._7_1_ = false;
  }
  return model_local._7_1_;
}

Assistant:

bool CoreML::hasIOS14NeuralNetworkFeatures(const Specification::Model& model) {

    // Return True if the model has the new Neural network features added in
    // ios 14

    if (hasDefaultValueForOptionalInputs(model)) {
        return true;
    }


    auto layers = getNNSpec(model);
    if (layers) {
        for (int i=0; i<layers->size(); i++){
            const Specification::NeuralNetworkLayer& layer = (*layers)[i];
            switch (layer.layer_case()) {
                case Specification::NeuralNetworkLayer::kCumSum:
                case Specification::NeuralNetworkLayer::kOneHot:
                case Specification::NeuralNetworkLayer::kClampedReLU:
                case Specification::NeuralNetworkLayer::kArgSort:
                case Specification::NeuralNetworkLayer::kPooling3D:
                case Specification::NeuralNetworkLayer::kGlobalPooling3D:
                case Specification::NeuralNetworkLayer::kSliceBySize:
                case Specification::NeuralNetworkLayer::kConvolution3D:
                    return true;
                case Specification::NeuralNetworkLayer::kSliceDynamic:
                    if (layer.input().size() == 7) {
                        return true;
                    } else if (layer.slicedynamic().squeezemasks_size()) {
                        return true;
                    }
                case Specification::NeuralNetworkLayer::kUpsample:
                    if (layer.upsample().linearupsamplemode() != Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT) {
                        return true;
                    }
                    if (layer.upsample().fractionalscalingfactor_size() > 0) {
                        return true;
                    }
                case Specification::NeuralNetworkLayer::kReorganizeData:
                    if (layer.reorganizedata().mode() == Specification::ReorganizeDataLayerParams::PIXEL_SHUFFLE) {
                      return true;
                    }
                case Specification::NeuralNetworkLayer::kInnerProduct:
                    if (layer.innerproduct().int8dynamicquantize())
                        return true;
                case Specification::NeuralNetworkLayer::kBatchedMatmul:
                    if (layer.batchedmatmul().int8dynamicquantize())
                        return true;
                default:
                    continue;
            }
        }
    }
    return false;
}